

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void load_buffer_32x8n(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift,
                      int height)

{
  int16_t *input_00;
  __m128i *in_00;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int col;
  __m128i *output;
  int16_t *in;
  int local_34;
  
  for (local_34 = 0; local_34 < (int)output; local_34 = local_34 + 1) {
    input_00 = (int16_t *)(in_RDI + (long)(local_34 * in_EDX) * 2);
    in_00 = (__m128i *)(in_RSI + (long)(local_34 << 3) * 0x10);
    load_buffer_4x4(input_00,in_00,4,in_ECX,in_R8D,in_R9D);
    load_buffer_4x4(input_00 + 0x10,in_00 + 4,4,in_ECX,in_R8D,in_R9D);
  }
  return;
}

Assistant:

static inline void load_buffer_32x8n(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift, const int height) {
  const int16_t *in = input;
  __m128i *output = out;
  for (int col = 0; col < height; col++) {
    in = input + col * stride;
    output = out + col * 8;
    load_buffer_4x4(in, output, 4, flipud, fliplr, shift);
    load_buffer_4x4((in + 16), (output + 4), 4, flipud, fliplr, shift);
  }
}